

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

void reset_nmv_counter(nmv_context *nmv)

{
  aom_cdf_prob *in_RDI;
  int num_cdfs_8;
  int array_size_8;
  aom_cdf_prob *cdf_ptr_8;
  int num_cdfs_7;
  int array_size_7;
  aom_cdf_prob *cdf_ptr_7;
  int num_cdfs_6;
  int array_size_6;
  aom_cdf_prob *cdf_ptr_6;
  int num_cdfs_5;
  int array_size_5;
  aom_cdf_prob *cdf_ptr_5;
  int num_cdfs_4;
  int array_size_4;
  aom_cdf_prob *cdf_ptr_4;
  int num_cdfs_3;
  int array_size_3;
  aom_cdf_prob *cdf_ptr_3;
  int num_cdfs_2;
  int array_size_2;
  aom_cdf_prob *cdf_ptr_2;
  int num_cdfs_1;
  int array_size_1;
  aom_cdf_prob *cdf_ptr_1;
  int i;
  int num_cdfs;
  int array_size;
  aom_cdf_prob *cdf_ptr;
  int local_1c;
  
  reset_cdf_symbol_counter(in_RDI,1,5,4);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 5,1,0xc,0xb);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x11,2,5,4);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x1b,1,5,4);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x20,1,3,2);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x23,1,3,2);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x26,1,3,2);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x29,1,3,2);
    reset_cdf_symbol_counter(in_RDI + (long)local_1c * 0x45 + 0x2c,10,3,2);
  }
  return;
}

Assistant:

static inline void reset_nmv_counter(nmv_context *nmv) {
  RESET_CDF_COUNTER(nmv->joints_cdf, 4);
  for (int i = 0; i < 2; i++) {
    RESET_CDF_COUNTER(nmv->comps[i].classes_cdf, MV_CLASSES);
    RESET_CDF_COUNTER(nmv->comps[i].class0_fp_cdf, MV_FP_SIZE);
    RESET_CDF_COUNTER(nmv->comps[i].fp_cdf, MV_FP_SIZE);
    RESET_CDF_COUNTER(nmv->comps[i].sign_cdf, 2);
    RESET_CDF_COUNTER(nmv->comps[i].class0_hp_cdf, 2);
    RESET_CDF_COUNTER(nmv->comps[i].hp_cdf, 2);
    RESET_CDF_COUNTER(nmv->comps[i].class0_cdf, CLASS0_SIZE);
    RESET_CDF_COUNTER(nmv->comps[i].bits_cdf, 2);
  }
}